

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Aig_Obj_t *
Dar_Balance_rec(Aig_Man_t *pNew,Aig_Obj_t *pObjOld,Vec_Vec_t *vStore,int Level,int fUpdateLevel)

{
  int iVar1;
  Aig_Type_t Type;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar2;
  abctime aVar3;
  int local_44;
  int i;
  Vec_Ptr_t *vSuper;
  Aig_Obj_t *pObjNew;
  int fUpdateLevel_local;
  int Level_local;
  Vec_Vec_t *vStore_local;
  Aig_Obj_t *pObjOld_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Aig_IsComplement(pObjOld);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                  ,0x1fb,
                  "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)");
  }
  iVar1 = Aig_ObjIsBuf(pObjOld);
  if (iVar1 == 0) {
    if ((pObjOld->field_5).pData == (void *)0x0) {
      iVar1 = Aig_ObjIsNode(pObjOld);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObjOld)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                      ,0x200,
                      "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)")
        ;
      }
      p = Dar_BalanceCone(pObjOld,vStore,Level);
      if (p->nSize == 0) {
        pNew_local = (Aig_Man_t *)Aig_ManConst0(pNew);
        (pObjOld->field_5).pData = pNew_local;
      }
      else {
        for (local_44 = 0; iVar1 = Vec_PtrSize(p), local_44 < iVar1; local_44 = local_44 + 1) {
          pAVar2 = Aig_Regular((Aig_Obj_t *)p->pArray[local_44]);
          pAVar2 = Dar_Balance_rec(pNew,pAVar2,vStore,Level + 1,fUpdateLevel);
          if (pAVar2 == (Aig_Obj_t *)0x0) {
            return (Aig_Obj_t *)0x0;
          }
          iVar1 = Aig_IsComplement((Aig_Obj_t *)p->pArray[local_44]);
          pAVar2 = Aig_NotCond(pAVar2,iVar1);
          p->pArray[local_44] = pAVar2;
        }
        if (p->nSize == 1) {
          pNew_local = (Aig_Man_t *)Vec_PtrEntry(p,0);
        }
        else {
          Type = Aig_ObjType(pObjOld);
          pNew_local = (Aig_Man_t *)Dar_BalanceBuildSuper(pNew,p,Type,fUpdateLevel);
          if (((pNew->Time2Quit != 0) &&
              (pAVar2 = Aig_Regular((Aig_Obj_t *)pNew_local), (pAVar2->Id & 0xffU) == 0)) &&
             (aVar3 = Abc_Clock(), pNew->Time2Quit < aVar3)) {
            return (Aig_Obj_t *)0x0;
          }
          if ((pObjOld->field_5).pData != (void *)0x0) {
            __assert_fail("pObjOld->pData == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                          ,0x21b,
                          "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)"
                         );
          }
          (pObjOld->field_5).pData = pNew_local;
        }
      }
    }
    else {
      pNew_local = (Aig_Man_t *)(pObjOld->field_5).pData;
    }
    return (Aig_Obj_t *)pNew_local;
  }
  __assert_fail("!Aig_ObjIsBuf(pObjOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                ,0x1fc,"Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)"
               );
}

Assistant:

Aig_Obj_t * Dar_Balance_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjOld, Vec_Vec_t * vStore, int Level, int fUpdateLevel )
{
    Aig_Obj_t * pObjNew;
    Vec_Ptr_t * vSuper;
    int i;
    assert( !Aig_IsComplement(pObjOld) );
    assert( !Aig_ObjIsBuf(pObjOld) );
    // return if the result is known
    if ( pObjOld->pData )
        return (Aig_Obj_t *)pObjOld->pData;
    assert( Aig_ObjIsNode(pObjOld) );
    // get the implication supergate
    vSuper = Dar_BalanceCone( pObjOld, vStore, Level );
    // check if supergate contains two nodes in the opposite polarity
    if ( vSuper->nSize == 0 )
        return (Aig_Obj_t *)(pObjOld->pData = Aig_ManConst0(pNew));
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < Vec_PtrSize(vSuper); i++ )
    {
        pObjNew = Dar_Balance_rec( pNew, Aig_Regular((Aig_Obj_t *)vSuper->pArray[i]), vStore, Level + 1, fUpdateLevel );
        if ( pObjNew == NULL )
            return NULL;
        vSuper->pArray[i] = Aig_NotCond( pObjNew, Aig_IsComplement((Aig_Obj_t *)vSuper->pArray[i]) );
    }
    // check for exactly one node
    if ( vSuper->nSize == 1 )
        return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
    // build the supergate
#ifdef USE_LUTSIZE_BALANCE
    pObjNew = Dar_BalanceBuildSuperTop( pNew, vSuper, Aig_ObjType(pObjOld), fUpdateLevel, 6 );
#else
    pObjNew = Dar_BalanceBuildSuper( pNew, vSuper, Aig_ObjType(pObjOld), fUpdateLevel );
#endif
    if ( pNew->Time2Quit && !(Aig_Regular(pObjNew)->Id & 255) && Abc_Clock() > pNew->Time2Quit )
        return NULL;
    // make sure the balanced node is not assigned
//    assert( pObjOld->Level >= Aig_Regular(pObjNew)->Level );
    assert( pObjOld->pData == NULL );
    return (Aig_Obj_t *)(pObjOld->pData = pObjNew);
}